

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::ConstantNamePrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view classname)

{
  php *__n;
  bool bVar1;
  int iVar2;
  string *extraout_RAX;
  string *psVar3;
  char *extraout_RDX;
  long lVar4;
  size_type __rlen;
  string_view name;
  string lower;
  string *local_50;
  php *local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = (string *)&local_40;
  local_48 = (php *)0x0;
  local_40 = 0;
  std::__cxx11::string::resize((ulong)&local_50,(char)this);
  absl::lts_20250127::ascii_internal::AsciiStrToLower
            ((Nonnull<char_*>)local_50,(Nullable<const_char_*>)classname._M_len,(size_t)this);
  name._M_str = extraout_RDX;
  name._M_len = (size_t)local_50;
  bVar1 = IsReservedName(local_48,name);
  __n = local_48;
  psVar3 = local_50;
  lVar4 = 8;
  do {
    if (__n == *(php **)((long)&PTR_typeinfo_0190f508 + lVar4)) {
      if (__n == (php *)0x0) goto LAB_00e0a91a;
      iVar2 = bcmp(psVar3,*(void **)((long)&kValidConstantNames[0]._M_len + lVar4),(size_t)__n);
      if (iVar2 == 0) goto LAB_00e0a91a;
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 200);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"PB","");
  }
  else {
LAB_00e0a91a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,anon_var_dwarf_a22956 + 5);
  }
  psVar3 = (string *)&local_40;
  if (local_50 != psVar3) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

std::string ConstantNamePrefix(absl::string_view classname) {
  bool is_reserved = false;

  std::string lower = absl::AsciiStrToLower(classname);

  is_reserved = IsReservedName(lower);

  for (int i = 0; i < kValidConstantNamesSize; i++) {
    if (lower == kValidConstantNames[i]) {
      is_reserved = false;
      break;
    }
  }

  if (is_reserved) {
    return "PB";
  }

  return "";
}